

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t mime_mem_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  long lVar1;
  size_t sVar2;
  
  sVar2 = curlx_sotouz(*(long *)((long)instream + 0x78) - *(long *)((long)instream + 0x90));
  if (nitems == 0) {
    nitems = 0xfffffffffffffffe;
  }
  else {
    if (sVar2 < nitems) {
      nitems = sVar2;
    }
    if (sVar2 != 0) {
      lVar1 = *(long *)((long)instream + 0x20);
      sVar2 = curlx_sotouz(*(curl_off_t *)((long)instream + 0x90));
      memcpy(buffer,(void *)(lVar1 + sVar2),nitems);
    }
  }
  return nitems;
}

Assistant:

static size_t mime_mem_read(char *buffer, size_t size, size_t nitems,
                            void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t sz = curlx_sotouz(part->datasize - part->state.offset);
  (void) size;   /* Always 1.*/

  if(!nitems)
    return STOP_FILLING;

  if(sz > nitems)
    sz = nitems;

  if(sz)
    memcpy(buffer, part->data + curlx_sotouz(part->state.offset), sz);

  return sz;
}